

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saa1099_vb.c
# Opt level: O1

void saa1099v_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  SAA_ENV_GEN *pSVar1;
  size_t __n;
  byte bVar2;
  byte bVar3;
  byte *pbVar4;
  long lVar5;
  char *pcVar6;
  short sVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  SAA_ENV_GEN *saaEGen;
  bool bVar15;
  bool bVar16;
  
  __n = (ulong)samples * 4;
  uVar14 = 0;
  memset(*outputs,0,__n);
  memset(outputs[1],0,__n);
  if (samples != 0 && *(char *)((long)param + 0x90) != '\0') {
    pSVar1 = (SAA_ENV_GEN *)((long)param + 0x7c);
    do {
      lVar5 = 0;
      pbVar4 = (byte *)((long)param + 8);
      do {
        if (pbVar4[0xd] == 0) {
          uVar10 = ((uint)lVar5 & 0xff) / 3;
          bVar2 = pbVar4[4];
          uVar8 = 1;
          uVar12 = 1;
          if (bVar2 == 0) {
LAB_0016d2ff:
            if (pbVar4[5] != 0) {
              uVar8 = *(uint *)((long)param + (ulong)(uVar10 << 4) + 0x60) & 1;
            }
            uVar8 = (uVar8 & uVar12) * 2;
          }
          else {
            if (pbVar4[5] == 0) {
              if (bVar2 != 0) {
                uVar12 = (uint)pbVar4[0xc];
              }
              goto LAB_0016d2ff;
            }
            bVar3 = pbVar4[0xc];
            uVar8 = (uint)bVar3;
            if (bVar3 != 0) {
              uVar8 = (uint)bVar3 + (*(uint *)((long)param + (ulong)(uVar10 << 4) + 0x60) & 1);
            }
          }
          if ((((char)lVar5 == '\x05') || (((uint)lVar5 & 0xff) == 2)) &&
             (pSVar1[uVar10].enable != '\0')) {
            iVar13 = (int)((uint)pSVar1[uVar10].volL *
                          *(int *)((long)param + (ulong)(*pbVar4 & 0xfffffffe) * 4 + 0xb4)) >> 4;
            iVar11 = (int)((uint)pSVar1[uVar10].volR *
                          *(int *)((long)param + (ulong)(pbVar4[1] & 0xfffffffe) * 4 + 0xb4)) >> 4;
            if (bVar2 == 0) {
              bVar15 = pbVar4[5] != 0;
              bVar16 = false;
            }
            else {
LAB_0016d3a8:
              bVar16 = false;
              bVar15 = true;
            }
          }
          else {
            iVar13 = *(int *)((long)param + (ulong)*pbVar4 * 4 + 0xb4);
            iVar11 = *(int *)((long)param + (ulong)pbVar4[1] * 4 + 0xb4);
            if (bVar2 != 0) goto LAB_0016d3a8;
            bVar16 = pbVar4[5] == 0;
            bVar15 = !bVar16;
          }
          if (bVar15) {
            uVar8 = uVar8 - 1;
            iVar13 = iVar13 * uVar8;
LAB_0016d3d1:
            (*outputs)[uVar14] = (*outputs)[uVar14] + iVar13;
            iVar11 = iVar11 * uVar8;
          }
          else {
            iVar13 = iVar13 * uVar8;
            if (bVar16) goto LAB_0016d3d1;
            (*outputs)[uVar14] =
                 (*outputs)[uVar14] +
                 (iVar13 - *(int *)((long)param + (ulong)(*pbVar4 & 0xfffffffe) * 4 + 0xb4));
            iVar11 = iVar11 * uVar8 -
                     *(int *)((long)param + (ulong)(pbVar4[1] & 0xfffffffe) * 4 + 0xb4);
          }
          outputs[1][uVar14] = outputs[1][uVar14] + iVar11;
        }
        lVar5 = lVar5 + 1;
        pbVar4 = pbVar4 + 0xe;
      } while (lVar5 != 6);
      uVar9 = *(long *)((long)param + 0x100) + *(long *)((long)param + 0xf8);
      *(ulong *)((long)param + 0x100) = uVar9;
      uVar9 = uVar9 >> 0x20;
      if (uVar9 != 0) {
        do {
          if (*(char *)((long)param + 0x91) == '\0') {
            lVar5 = 0x14;
            do {
              sVar7 = (short)(-1 << (*(byte *)((long)param + lVar5 + -9) & 0x1f)) +
                      *(short *)((long)param + lVar5 + -6);
              *(short *)((long)param + lVar5 + -6) = sVar7;
              *(byte *)((long)param + lVar5 + -1) = (byte)((ushort)sVar7 >> 0xf);
              if (sVar7 < 0) {
                *(short *)((long)param + lVar5 + -6) = *(short *)((long)param + lVar5 + -4) + sVar7;
                pbVar4 = (byte *)((long)param + lVar5 + -2);
                *pbVar4 = *pbVar4 ^ 1;
                if (*(char *)((long)param + lVar5 + -2) == '\0') {
                  *(byte *)((long)param + lVar5) = *(byte *)((long)param + lVar5) ^ 1;
                }
              }
              lVar5 = lVar5 + 0xe;
            } while (lVar5 != 0x68);
          }
          lVar5 = 0x69;
          pcVar6 = (char *)((long)param + 0x13);
          do {
            sVar7 = -1;
            if (*(char *)((long)param + lVar5 + -0xd) == '\x03') {
              if (*pcVar6 == '\0') {
                sVar7 = 0;
              }
              else {
                sVar7 = -(ushort)(pcVar6[-1] == '\0');
              }
            }
            sVar7 = sVar7 + *(short *)((long)param + lVar5 + -5);
            *(short *)((long)param + lVar5 + -5) = sVar7;
            *(byte *)((long)param + lVar5) = (byte)((ushort)sVar7 >> 0xf);
            if (sVar7 < 0) {
              *(short *)((long)param + lVar5 + -5) = *(short *)((long)param + lVar5 + -3) + sVar7;
              pbVar4 = (byte *)((long)param + lVar5 + -1);
              *pbVar4 = *pbVar4 ^ 1;
              uVar8 = *(uint *)((long)param + lVar5 + -9);
              *(uint *)((long)param + lVar5 + -9) = ((uVar8 >> 10 ^ uVar8 >> 0x11) & 1) + uVar8 * 2;
            }
            pcVar6 = pcVar6 + 0x2a;
            lVar5 = lVar5 + 0x10;
          } while (lVar5 == 0x79);
          lVar5 = 0;
          pcVar6 = (char *)((long)param + 0x21);
          saaEGen = pSVar1;
          do {
            if (((saaEGen->extClock == '\0') && (*pcVar6 != '\0')) && (pcVar6[-1] == '\0')) {
              if (((char)saaEGen->flags < '\0') && (saaEGen->reload != '\0')) {
                saa_envgen_load((SAA_CHIP *)param,(UINT8)lVar5);
              }
              saa_envgen_step(saaEGen);
            }
            lVar5 = lVar5 + 1;
            pcVar6 = pcVar6 + 0x2a;
            saaEGen = saaEGen + 1;
          } while (lVar5 == 1);
          uVar8 = (int)uVar9 - 1;
          uVar9 = (ulong)uVar8;
        } while (uVar8 != 0);
      }
      *(undefined4 *)((long)param + 0x104) = 0;
      uVar14 = uVar14 + 1;
    } while (uVar14 != samples);
  }
  return;
}

Assistant:

static void saa1099v_update(void* param, UINT32 samples, DEV_SMPL** outputs)
{
	SAA_CHIP* saa = (SAA_CHIP*)param;
	SAA_CHN* saaCh;
	UINT32 curSmpl;
	UINT8 curChn;
	UINT8 neChn;	// noise/envelope channel
	UINT8 noDCremove;
	DEV_SMPL outState;
	DEV_SMPL outVolL;
	DEV_SMPL outVolR;
	
	memset(outputs[0], 0, samples * sizeof(DEV_SMPL));
	memset(outputs[1], 0, samples * sizeof(DEV_SMPL));
	if (! saa->allOn)
		return;
	
	for (curSmpl = 0; curSmpl < samples; curSmpl ++)
	{
		for (curChn = 0; curChn < 6; curChn ++)
		{
			saaCh = &saa->channels[curChn];
			if (saaCh->muted)
				continue;
			neChn = curChn / 3;
			noDCremove = 0;
			
			if (saaCh->toneOn && saaCh->noiseOn)
			{
				// mixing tone+noise works like this
				outState = saaCh->state;
				if (saaCh->state)
					outState += (saa->noise[neChn].state & 0x01);
			}
			else
			{
				outState  = (saaCh->toneOn) ? saaCh->state : 1;
				outState &= (saaCh->noiseOn) ? (saa->noise[neChn].state & 0x01) : 1;
				outState *= 2;	// make the same amplitude as when mixing tone+noise
			}
			
			if ((curChn == 2 || curChn == 5) && saa->env[neChn].enable)
			{
				// enabling the envelope generator disables amplitude bit 0
				outVolL = (saa->volTbl[saaCh->volL & ~0x01] * saa->env[neChn].volL) >> 4;
				outVolR = (saa->volTbl[saaCh->volR & ~0x01] * saa->env[neChn].volR) >> 4;
				if (! saaCh->toneOn && ! saaCh->noiseOn)
					noDCremove = 2;
			}
			else
			{
				outVolL = saa->volTbl[saaCh->volL];
				outVolR = saa->volTbl[saaCh->volR];
				if (! saaCh->toneOn && ! saaCh->noiseOn)
					noDCremove = 1;
			}
			
			// tone XOR noise enabled: outState can be: 0 [off], 2 [on]
			// tone + noise enabled: outState can be: 0 [both off], 1 [only tone on], 2 [both on]
			if (! noDCremove)
			{
				outState = outState - 1;	// DC offset removal and make bipolar
				outputs[0][curSmpl] += outState * outVolL;
				outputs[1][curSmpl] += outState * outVolR;
			}
			else if (noDCremove == 1)
			{
				// just ignore offset removal (makes software-PCM work)
				outputs[0][curSmpl] += outState * outVolL;
				outputs[1][curSmpl] += outState * outVolR;
			}
			else //if (noDCremove == 2)
			{
				// set "center" based on current volume level (for EnvGen-based sounds)
				outputs[0][curSmpl] += outState * outVolL - saa->volTbl[saaCh->volL & ~0x01];
				outputs[1][curSmpl] += outState * outVolR - saa->volTbl[saaCh->volR & ~0x01];
			}
		}
		
		// Updating after calculating the sample output improves emulation of a few artifacts.
		// (like the peak down after the frequency generator reset)
		RC_STEP(&saa->stepCntr);
		saa_advance(saa, RC_GET_VAL(&saa->stepCntr));
		RC_MASK(&saa->stepCntr);
	}
	
	return;
}